

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O3

date_t duckdb::Date::FromCString(char *buf,idx_t len,bool strict)

{
  DateCastResult DVar1;
  ConversionException *pCVar2;
  date_t result;
  idx_t pos;
  bool local_75;
  date_t local_74;
  string local_70;
  string local_50;
  idx_t local_30;
  
  DVar1 = TryConvertDate(buf,len,&local_30,&local_74,&local_75,strict);
  if (DVar1 == ERROR_RANGE) {
    pCVar2 = (ConversionException *)__cxa_allocate_exception(0x10);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,buf,buf + len);
    RangeError(&local_50,&local_70);
    ConversionException::ConversionException(pCVar2,&local_50);
    __cxa_throw(pCVar2,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (DVar1 != ERROR_INCORRECT_FORMAT) {
    return (date_t)local_74.days;
  }
  pCVar2 = (ConversionException *)__cxa_allocate_exception(0x10);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,buf,buf + len);
  FormatError(&local_50,&local_70);
  ConversionException::ConversionException(pCVar2,&local_50);
  __cxa_throw(pCVar2,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

date_t Date::FromCString(const char *buf, idx_t len, bool strict) {
	date_t result;
	idx_t pos;
	bool special = false;
	switch (TryConvertDate(buf, len, pos, result, special, strict)) {
	case DateCastResult::ERROR_INCORRECT_FORMAT:
		throw ConversionException(FormatError(string(buf, len)));
	case DateCastResult::ERROR_RANGE:
		throw ConversionException(RangeError(string(buf, len)));
	case DateCastResult::SUCCESS:
		break;
	}
	return result;
}